

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O0

CURLcode rtp_client_write(connectdata *conn,char *ptr,size_t len)

{
  SessionHandle *data_00;
  size_t sVar1;
  curl_write_callback local_48;
  curl_write_callback writeit;
  size_t wrote;
  SessionHandle *data;
  size_t len_local;
  char *ptr_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if (len == 0) {
    Curl_failf(data_00,"Cannot write a 0 size RTP packet.");
    conn_local._4_4_ = CURLE_WRITE_ERROR;
  }
  else {
    if ((data_00->set).fwrite_rtp == (curl_write_callback)0x0) {
      local_48 = (data_00->set).fwrite_func;
    }
    else {
      local_48 = (data_00->set).fwrite_rtp;
    }
    sVar1 = (*local_48)(ptr,1,len,(data_00->set).rtp_out);
    if (sVar1 == 0x10000001) {
      Curl_failf(data_00,"Cannot pause RTP");
      conn_local._4_4_ = CURLE_WRITE_ERROR;
    }
    else if (sVar1 == len) {
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data_00,"Failed writing RTP data");
      conn_local._4_4_ = CURLE_WRITE_ERROR;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static
CURLcode rtp_client_write(struct connectdata *conn, char *ptr, size_t len)
{
  struct SessionHandle *data = conn->data;
  size_t wrote;
  curl_write_callback writeit;

  if(len == 0) {
    failf (data, "Cannot write a 0 size RTP packet.");
    return CURLE_WRITE_ERROR;
  }

  writeit = data->set.fwrite_rtp?data->set.fwrite_rtp:data->set.fwrite_func;
  wrote = writeit(ptr, 1, len, data->set.rtp_out);

  if(CURL_WRITEFUNC_PAUSE == wrote) {
    failf (data, "Cannot pause RTP");
    return CURLE_WRITE_ERROR;
  }

  if(wrote != len) {
    failf (data, "Failed writing RTP data");
    return CURLE_WRITE_ERROR;
  }

  return CURLE_OK;
}